

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O3

void __thiscall embree::XMLWriter::store_array_elt(XMLWriter *this,Vec2f *v)

{
  ostream *poVar1;
  
  poVar1 = std::ostream::_M_insert<double>((double)(v->field_0).field_0.x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::ostream::_M_insert<double>((double)(v->field_0).field_0.y);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void XMLWriter::store_array_elt(const Vec2f& v) {
    xml << v.x << " " << v.y << std::endl;
  }